

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tagger.cpp
# Opt level: O0

char * __thiscall
MeCab::anon_unknown_0::TaggerImpl::parse
          (TaggerImpl *this,char *str,size_t len,char *out,size_t len2)

{
  int iVar1;
  Lattice *pLVar2;
  ulong uVar3;
  undefined4 extraout_var;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  char *in_RDI;
  undefined8 in_R8;
  char *result;
  Lattice *lattice;
  TaggerImpl *in_stack_ffffffffffffffc0;
  TaggerImpl *local_8;
  
  pLVar2 = mutable_lattice(in_stack_ffffffffffffffc0);
  (*pLVar2->_vptr_Lattice[10])(pLVar2,in_RSI,in_RDX);
  initRequestType(in_stack_ffffffffffffffc0);
  uVar3 = (*(code *)**(undefined8 **)in_RDI)(in_RDI,pLVar2);
  if ((uVar3 & 1) == 0) {
    (*pLVar2->_vptr_Lattice[0x24])();
    set_what(in_stack_ffffffffffffffc0,in_RDI);
    local_8 = (TaggerImpl *)0x0;
  }
  else {
    iVar1 = (*pLVar2->_vptr_Lattice[0x1b])(pLVar2,in_RCX,in_R8);
    local_8 = (TaggerImpl *)CONCAT44(extraout_var,iVar1);
    if (local_8 == (TaggerImpl *)0x0) {
      (*pLVar2->_vptr_Lattice[0x24])();
      set_what(local_8,in_RDI);
      local_8 = (TaggerImpl *)0x0;
    }
  }
  return (char *)local_8;
}

Assistant:

const char *TaggerImpl::parse(const char *str, size_t len,
                              char *out, size_t len2) {
  Lattice *lattice = mutable_lattice();
  lattice->set_sentence(str, len);
  initRequestType();
  if (!parse(lattice)) {
    set_what(lattice->what());
    return 0;
  }
  const char *result = lattice->toString(out, len2);
  if (!result) {
    set_what(lattice->what());
    return 0;
  }
  return result;
}